

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_16781328,_true,_embree::avx512::VirtualCurveIntersectorK<4>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar1;
  BVH *bvh;
  size_t sVar2;
  void *pvVar3;
  bool bVar4;
  bool bVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  undefined8 uVar9;
  ulong uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [12];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  byte bVar36;
  char cVar37;
  byte bVar38;
  byte bVar39;
  size_t mask;
  ulong uVar40;
  byte bVar41;
  ushort uVar42;
  uint uVar43;
  NodeRef *pNVar44;
  NodeRef root;
  uint uVar45;
  undefined4 uVar46;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar47;
  bool bVar48;
  ulong uVar49;
  ulong uVar50;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  vint4 bi_13;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  vint4 ai_2;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  vint4 ai_1;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  vint4 ai_3;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  vint4 bi;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 in_ZMM4 [64];
  vint4 bi_1;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  vint4 bi_3;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar89;
  float fVar90;
  float fVar91;
  vint4 bi_2;
  float fVar92;
  vfloat4 a0;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  vint4 ai;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 in_ZMM26 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  TravRayK<4,_true> tray;
  Precalculations pre;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  int iVar51;
  int iVar67;
  int iVar68;
  int iVar69;
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar57 = *(undefined1 (*) [16])(ray + 0x80);
    auVar54 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
    auVar29 = ZEXT812(0) << 0x20;
    auVar55 = ZEXT816(0) << 0x40;
    uVar9 = vcmpps_avx512vl(auVar57,auVar55,5);
    uVar49 = vpcmpeqd_avx512vl(auVar54,(undefined1  [16])valid_i->field_0);
    uVar49 = ((byte)uVar9 & 0xf) & uVar49;
    bVar39 = (byte)uVar49;
    if (bVar39 != 0) {
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar52._0_4_ = tray.dir.field_0._32_4_ * tray.dir.field_0._32_4_;
      auVar52._4_4_ = tray.dir.field_0._36_4_ * tray.dir.field_0._36_4_;
      auVar52._8_4_ = tray.dir.field_0._40_4_ * tray.dir.field_0._40_4_;
      auVar52._12_4_ = tray.dir.field_0._44_4_ * tray.dir.field_0._44_4_;
      auVar53 = vfmadd231ps_fma(auVar52,(undefined1  [16])tray.dir.field_0.field_0.y.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar53 = vfmadd231ps_fma(auVar53,(undefined1  [16])tray.dir.field_0.field_0.x.field_0,
                                (undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar52 = vrsqrt14ps_avx512vl(auVar53);
      auVar56._8_4_ = 0xbf000000;
      auVar56._0_8_ = 0xbf000000bf000000;
      auVar56._12_4_ = 0xbf000000;
      auVar53 = vmulps_avx512vl(auVar53,auVar56);
      fVar89 = auVar52._0_4_;
      fVar90 = auVar52._4_4_;
      fVar91 = auVar52._8_4_;
      fVar92 = auVar52._12_4_;
      auVar58._0_4_ = fVar89 * fVar89 * fVar89 * auVar53._0_4_;
      auVar58._4_4_ = fVar90 * fVar90 * fVar90 * auVar53._4_4_;
      auVar58._8_4_ = fVar91 * fVar91 * fVar91 * auVar53._8_4_;
      auVar58._12_4_ = fVar92 * fVar92 * fVar92 * auVar53._12_4_;
      auVar53._8_4_ = 0x3fc00000;
      auVar53._0_8_ = 0x3fc000003fc00000;
      auVar53._12_4_ = 0x3fc00000;
      pre.depth_scale.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vfmadd231ps_avx512vl(auVar58,auVar52,auVar53);
      auVar59._8_4_ = 0x80000000;
      auVar59._0_8_ = 0x8000000080000000;
      auVar59._12_4_ = 0x80000000;
      uVar40 = uVar49;
      do {
        lVar13 = 0;
        for (uVar50 = uVar40; (uVar50 & 1) == 0; uVar50 = uVar50 >> 1 | 0x8000000000000000) {
          lVar13 = lVar13 + 1;
        }
        uVar50 = (ulong)(uint)((int)lVar13 * 4);
        auVar53 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar50 + 0x40)),
                                ZEXT416(*(uint *)(ray + uVar50 + 0x50)),0x1c);
        fVar89 = *(float *)((long)pre.ray_space + (uVar50 - 0x10));
        auVar53 = vinsertps_avx(auVar53,ZEXT416(*(uint *)(ray + uVar50 + 0x60)),0x28);
        auVar64._0_4_ = auVar53._0_4_ * fVar89;
        auVar64._4_4_ = auVar53._4_4_ * fVar89;
        auVar64._8_4_ = auVar53._8_4_ * fVar89;
        auVar64._12_4_ = auVar53._12_4_ * fVar89;
        auVar56 = vshufpd_avx(auVar64,auVar64,1);
        auVar53 = vmovshdup_avx(auVar64);
        auVar98._0_4_ = auVar53._0_4_ ^ 0x80000000;
        auVar58 = vunpckhps_avx(auVar64,auVar55);
        auVar66._0_8_ = auVar56._0_8_ ^ 0x8000000080000000;
        auVar66._8_8_ = auVar56._8_8_ ^ auVar59._8_8_;
        auVar52 = vinsertps_avx(auVar66,auVar64,0x2a);
        auVar53 = vdpps_avx(auVar52,auVar52,0x7f);
        auVar98._4_12_ = auVar29;
        auVar58 = vshufps_avx(auVar58,auVar98,0x41);
        auVar56 = vdpps_avx(auVar58,auVar58,0x7f);
        uVar9 = vcmpps_avx512vl(auVar53,auVar56,1);
        auVar53 = vpmovm2d_avx512vl(uVar9);
        auVar101._0_4_ = auVar53._0_4_;
        auVar101._4_4_ = auVar101._0_4_;
        auVar101._8_4_ = auVar101._0_4_;
        auVar101._12_4_ = auVar101._0_4_;
        uVar50 = vpmovd2m_avx512vl(auVar101);
        auVar60._4_4_ = (uint)((byte)(uVar50 >> 1) & 1) * auVar54._4_4_;
        auVar60._0_4_ = (uint)((byte)uVar50 & 1) * auVar54._0_4_;
        auVar60._8_4_ = (uint)((byte)(uVar50 >> 2) & 1) * auVar54._8_4_;
        auVar60._12_4_ = (uint)((byte)(uVar50 >> 3) & 1) * auVar54._12_4_;
        auVar53 = vblendvps_avx(auVar52,auVar58,auVar60);
        auVar56 = vdpps_avx(auVar53,auVar53,0x7f);
        auVar102._4_12_ = auVar29;
        auVar102._0_4_ = auVar56._0_4_;
        auVar52 = vrsqrt14ss_avx512f(auVar55,auVar102);
        fVar90 = auVar52._0_4_;
        fVar90 = fVar90 * 1.5 - auVar56._0_4_ * 0.5 * fVar90 * fVar90 * fVar90;
        auVar95._0_4_ = auVar53._0_4_ * fVar90;
        auVar95._4_4_ = auVar53._4_4_ * fVar90;
        auVar95._8_4_ = auVar53._8_4_ * fVar90;
        auVar95._12_4_ = auVar53._12_4_ * fVar90;
        auVar53 = vshufps_avx(auVar95,auVar95,0xc9);
        auVar56 = vshufps_avx(auVar64,auVar64,0xc9);
        auVar103._0_4_ = auVar95._0_4_ * auVar56._0_4_;
        auVar103._4_4_ = auVar95._4_4_ * auVar56._4_4_;
        auVar103._8_4_ = auVar95._8_4_ * auVar56._8_4_;
        auVar103._12_4_ = auVar95._12_4_ * auVar56._12_4_;
        auVar53 = vfmsub231ps_fma(auVar103,auVar64,auVar53);
        auVar56 = vshufps_avx(auVar53,auVar53,0xc9);
        auVar53 = vdpps_avx(auVar56,auVar56,0x7f);
        uVar40 = uVar40 - 1 & uVar40;
        auVar104._4_12_ = auVar29;
        auVar104._0_4_ = auVar53._0_4_;
        auVar52 = vrsqrt14ss_avx512f(auVar55,auVar104);
        fVar90 = auVar52._0_4_;
        fVar90 = fVar90 * 1.5 - auVar53._0_4_ * 0.5 * fVar90 * fVar90 * fVar90;
        auVar99._0_4_ = fVar90 * auVar56._0_4_;
        auVar99._4_4_ = fVar90 * auVar56._4_4_;
        auVar99._8_4_ = fVar90 * auVar56._8_4_;
        auVar99._12_4_ = fVar90 * auVar56._12_4_;
        auVar65._0_4_ = fVar89 * auVar64._0_4_;
        auVar65._4_4_ = fVar89 * auVar64._4_4_;
        auVar65._8_4_ = fVar89 * auVar64._8_4_;
        auVar65._12_4_ = fVar89 * auVar64._12_4_;
        auVar52 = vunpcklps_avx(auVar95,auVar65);
        auVar53 = vunpckhps_avx(auVar95,auVar65);
        auVar58 = vunpcklps_avx(auVar99,auVar55);
        auVar56 = vunpckhps_avx(auVar99,auVar55);
        aVar7 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar53,auVar56);
        aVar8 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar52,auVar58);
        aVar6 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar52,auVar58);
        pre.ray_space[lVar13].vx.field_0 = aVar8;
        pre.ray_space[lVar13].vy.field_0 = aVar6;
        pre.ray_space[lVar13].vz.field_0 = aVar7;
      } while (uVar40 != 0);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      auVar54 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar107 = ZEXT1664(auVar54);
      auVar55 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar54);
      auVar53 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      auVar108 = ZEXT1664(auVar53);
      uVar40 = vcmpps_avx512vl(auVar55,auVar53,1);
      auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar109 = ZEXT1664(auVar55);
      auVar56 = vdivps_avx512vl(auVar55,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar52 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar54);
      uVar50 = vcmpps_avx512vl(auVar52,auVar53,1);
      auVar52 = vdivps_avx512vl(auVar55,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar54 = vandps_avx512vl((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar54);
      uVar10 = vcmpps_avx512vl(auVar54,auVar53,1);
      auVar54 = vdivps_avx512vl(auVar55,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      bVar48 = (bool)((byte)uVar40 & 1);
      tray.rdir.field_0._0_4_ = (uint)bVar48 * 0x5d5e0b6b | (uint)!bVar48 * auVar56._0_4_;
      bVar48 = (bool)((byte)(uVar40 >> 1) & 1);
      tray.rdir.field_0._4_4_ = (uint)bVar48 * 0x5d5e0b6b | (uint)!bVar48 * auVar56._4_4_;
      bVar48 = (bool)((byte)(uVar40 >> 2) & 1);
      tray.rdir.field_0._8_4_ = (uint)bVar48 * 0x5d5e0b6b | (uint)!bVar48 * auVar56._8_4_;
      bVar48 = (bool)((byte)(uVar40 >> 3) & 1);
      tray.rdir.field_0._12_4_ = (uint)bVar48 * 0x5d5e0b6b | (uint)!bVar48 * auVar56._12_4_;
      bVar48 = (bool)((byte)uVar50 & 1);
      tray.rdir.field_0._16_4_ = (uint)bVar48 * 0x5d5e0b6b | (uint)!bVar48 * auVar52._0_4_;
      bVar48 = (bool)((byte)(uVar50 >> 1) & 1);
      tray.rdir.field_0._20_4_ = (uint)bVar48 * 0x5d5e0b6b | (uint)!bVar48 * auVar52._4_4_;
      bVar48 = (bool)((byte)(uVar50 >> 2) & 1);
      tray.rdir.field_0._24_4_ = (uint)bVar48 * 0x5d5e0b6b | (uint)!bVar48 * auVar52._8_4_;
      bVar48 = (bool)((byte)(uVar50 >> 3) & 1);
      tray.rdir.field_0._28_4_ = (uint)bVar48 * 0x5d5e0b6b | (uint)!bVar48 * auVar52._12_4_;
      bVar48 = (bool)((byte)uVar10 & 1);
      tray.rdir.field_0._32_4_ = (uint)bVar48 * 0x5d5e0b6b | (uint)!bVar48 * auVar54._0_4_;
      bVar48 = (bool)((byte)(uVar10 >> 1) & 1);
      tray.rdir.field_0._36_4_ = (uint)bVar48 * 0x5d5e0b6b | (uint)!bVar48 * auVar54._4_4_;
      bVar48 = (bool)((byte)(uVar10 >> 2) & 1);
      tray.rdir.field_0._40_4_ = (uint)bVar48 * 0x5d5e0b6b | (uint)!bVar48 * auVar54._8_4_;
      bVar48 = (bool)((byte)(uVar10 >> 3) & 1);
      tray.rdir.field_0._44_4_ = (uint)bVar48 * 0x5d5e0b6b | (uint)!bVar48 * auVar54._12_4_;
      auVar54 = vxorps_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
      auVar110 = ZEXT1664(auVar54);
      uVar40 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar54,1);
      auVar55 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar40 >> 1) & 1) * auVar55._4_4_;
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar40 & 1) * auVar55._0_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar40 >> 2) & 1) * auVar55._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar40 >> 3) & 1) * auVar55._12_4_;
      uVar40 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar54,5);
      auVar55 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar48 = (bool)((byte)uVar40 & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar48 * auVar55._0_4_ | (uint)!bVar48 * 0x60;
      bVar48 = (bool)((byte)(uVar40 >> 1) & 1);
      tray.nearXYZ.field_0._20_4_ = (uint)bVar48 * auVar55._4_4_ | (uint)!bVar48 * 0x60;
      bVar48 = (bool)((byte)(uVar40 >> 2) & 1);
      tray.nearXYZ.field_0._24_4_ = (uint)bVar48 * auVar55._8_4_ | (uint)!bVar48 * 0x60;
      bVar48 = (bool)((byte)(uVar40 >> 3) & 1);
      tray.nearXYZ.field_0._28_4_ = (uint)bVar48 * auVar55._12_4_ | (uint)!bVar48 * 0x60;
      uVar40 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar54,5);
      auVar55 = vpbroadcastd_avx512vl(ZEXT416(0x80));
      bVar48 = (bool)((byte)uVar40 & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar48 * auVar55._0_4_ | (uint)!bVar48 * 0xa0;
      bVar48 = (bool)((byte)(uVar40 >> 1) & 1);
      tray.nearXYZ.field_0._36_4_ = (uint)bVar48 * auVar55._4_4_ | (uint)!bVar48 * 0xa0;
      bVar48 = (bool)((byte)(uVar40 >> 2) & 1);
      tray.nearXYZ.field_0._40_4_ = (uint)bVar48 * auVar55._8_4_ | (uint)!bVar48 * 0xa0;
      bVar48 = (bool)((byte)(uVar40 >> 3) & 1);
      tray.nearXYZ.field_0._44_4_ = (uint)bVar48 * auVar55._12_4_ | (uint)!bVar48 * 0xa0;
      stack_near[0].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vbroadcastss_avx512vl(ZEXT416(0x7f800000))
      ;
      auVar112 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar55 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar54);
      tray.tnear.field_0._0_4_ =
           (uint)(bVar39 & 1) * auVar55._0_4_ |
           (uint)!(bool)(bVar39 & 1) * stack_near[0].field_0._0_4_;
      bVar48 = (bool)((byte)(uVar49 >> 1) & 1);
      tray.tnear.field_0._4_4_ =
           (uint)bVar48 * auVar55._4_4_ | (uint)!bVar48 * stack_near[0].field_0._4_4_;
      bVar48 = (bool)((byte)(uVar49 >> 2) & 1);
      tray.tnear.field_0._8_4_ =
           (uint)bVar48 * auVar55._8_4_ | (uint)!bVar48 * stack_near[0].field_0._8_4_;
      bVar48 = SUB81(uVar49 >> 3,0);
      tray.tnear.field_0._12_4_ =
           (uint)bVar48 * auVar55._12_4_ | (uint)!bVar48 * stack_near[0].field_0._12_4_;
      auVar55 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar111 = ZEXT1664(auVar55);
      auVar57 = vmaxps_avx512vl(auVar57,auVar54);
      tray.tfar.field_0.i[0] =
           (uint)(bVar39 & 1) * auVar57._0_4_ | (uint)!(bool)(bVar39 & 1) * auVar55._0_4_;
      bVar48 = (bool)((byte)(uVar49 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar48 * auVar57._4_4_ | (uint)!bVar48 * auVar55._4_4_;
      bVar48 = (bool)((byte)(uVar49 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar48 * auVar57._8_4_ | (uint)!bVar48 * auVar55._8_4_;
      bVar48 = SUB81(uVar49 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar48 * auVar57._12_4_ | (uint)!bVar48 * auVar55._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar45 = 3;
      }
      else {
        uVar45 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      uVar42 = (ushort)uVar49 ^ 0xf;
      pNVar44 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar47 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
      auVar113 = ZEXT1664(auVar57);
      auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
      auVar114 = ZEXT1664(auVar57);
      do {
        paVar47 = paVar47 + -1;
        root.ptr = pNVar44[-1].ptr;
        pNVar44 = pNVar44 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_008248a1:
          iVar51 = 3;
        }
        else {
          aVar1 = *paVar47;
          uVar49 = vcmpps_avx512vl((undefined1  [16])aVar1,(undefined1  [16])tray.tfar.field_0,1);
          if ((char)uVar49 == '\0') {
LAB_008248a5:
            iVar51 = 2;
          }
          else {
            uVar46 = (undefined4)uVar49;
            iVar51 = 0;
            if ((uint)POPCOUNT(uVar46) <= uVar45) {
              do {
                sVar2 = 0;
                for (uVar40 = uVar49; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000)
                {
                  sVar2 = sVar2 + 1;
                }
                bVar48 = occluded1(This,bvh,root,sVar2,&pre,ray,&tray,context);
                bVar36 = (byte)(1 << ((uint)sVar2 & 0x1f));
                if (!bVar48) {
                  bVar36 = 0;
                }
                bVar36 = (byte)uVar42 | bVar36;
                uVar42 = (ushort)bVar36;
                uVar49 = uVar49 - 1 & uVar49;
              } while (uVar49 != 0);
              if (bVar36 == 0xf) {
                iVar51 = 3;
              }
              else {
                auVar57 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                tray.tfar.field_0.i[0] =
                     (uint)(bVar36 & 1) * auVar57._0_4_ |
                     (uint)!(bool)(bVar36 & 1) * tray.tfar.field_0.i[0];
                bVar48 = (bool)(bVar36 >> 1 & 1);
                tray.tfar.field_0.i[1] =
                     (uint)bVar48 * auVar57._4_4_ | (uint)!bVar48 * tray.tfar.field_0.i[1];
                bVar48 = (bool)(bVar36 >> 2 & 1);
                tray.tfar.field_0.i[2] =
                     (uint)bVar48 * auVar57._8_4_ | (uint)!bVar48 * tray.tfar.field_0.i[2];
                bVar48 = (bool)(bVar36 >> 3 & 1);
                tray.tfar.field_0.i[3] =
                     (uint)bVar48 * auVar57._12_4_ | (uint)!bVar48 * tray.tfar.field_0.i[3];
                iVar51 = 2;
              }
              auVar57 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar107 = ZEXT1664(auVar57);
              auVar57 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
              auVar108 = ZEXT1664(auVar57);
              auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
              auVar109 = ZEXT1664(auVar57);
              auVar57 = vxorps_avx512vl(auVar110._0_16_,auVar110._0_16_);
              auVar110 = ZEXT1664(auVar57);
              auVar57 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              auVar111 = ZEXT1664(auVar57);
              auVar57 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              auVar112 = ZEXT1664(auVar57);
              auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
              auVar113 = ZEXT1664(auVar57);
              auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
              auVar114 = ZEXT1664(auVar57);
            }
            auVar57 = auVar110._0_16_;
            auVar115 = ZEXT1664((undefined1  [16])aVar1);
            if (uVar45 < (uint)POPCOUNT(uVar46)) {
              do {
                if ((root.ptr & 8) != 0) {
                  if (root.ptr == 0xfffffffffffffff8) goto LAB_008248a1;
                  uVar9 = vcmpps_avx512vl(auVar115._0_16_,(undefined1  [16])tray.tfar.field_0,9);
                  if ((char)uVar9 != '\0') {
                    bVar36 = (byte)uVar42 & 0xf;
                    if (bVar36 == 0xf) {
                      bVar38 = 0;
                    }
                    else {
                      uVar49 = (ulong)(bVar36 ^ 0xf);
                      bVar36 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                      pvVar3 = This->leafIntersector;
                      bVar38 = 0;
                      do {
                        lVar13 = 0;
                        for (uVar40 = uVar49; (uVar40 & 1) == 0;
                            uVar40 = uVar40 >> 1 | 0x8000000000000000) {
                          lVar13 = lVar13 + 1;
                        }
                        cVar37 = (**(code **)((long)pvVar3 + (ulong)bVar36 * 0x40 + 0x18))
                                           (&pre,ray,lVar13,context,
                                            (byte *)(root.ptr & 0xfffffffffffffff0));
                        auVar57 = auVar110._0_16_;
                        bVar41 = (byte)(1 << ((uint)lVar13 & 0x1f));
                        if (cVar37 == '\0') {
                          bVar41 = 0;
                        }
                        bVar38 = bVar38 | bVar41;
                        uVar49 = uVar49 - 1 & uVar49;
                      } while (uVar49 != 0);
                    }
                    bVar38 = (byte)uVar42 | bVar38;
                    uVar42 = (ushort)bVar38;
                    if (bVar38 == 0xf) {
                      iVar51 = 3;
                    }
                    else {
                      auVar54 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      tray.tfar.field_0.i[0] =
                           (uint)(bVar38 & 1) * auVar54._0_4_ |
                           (uint)!(bool)(bVar38 & 1) * tray.tfar.field_0.i[0];
                      bVar48 = (bool)(bVar38 >> 1 & 1);
                      tray.tfar.field_0.i[1] =
                           (uint)bVar48 * auVar54._4_4_ | (uint)!bVar48 * tray.tfar.field_0.i[1];
                      bVar48 = (bool)(bVar38 >> 2 & 1);
                      tray.tfar.field_0.i[2] =
                           (uint)bVar48 * auVar54._8_4_ | (uint)!bVar48 * tray.tfar.field_0.i[2];
                      bVar48 = (bool)(bVar38 >> 3 & 1);
                      tray.tfar.field_0.i[3] =
                           (uint)bVar48 * auVar54._12_4_ | (uint)!bVar48 * tray.tfar.field_0.i[3];
                      iVar51 = 0;
                    }
                    auVar54 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar107 = ZEXT1664(auVar54);
                    auVar54 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                    auVar108 = ZEXT1664(auVar54);
                    auVar54 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar109 = ZEXT1664(auVar54);
                    auVar57 = vxorps_avx512vl(auVar57,auVar57);
                    auVar110 = ZEXT1664(auVar57);
                    auVar57 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    auVar111 = ZEXT1664(auVar57);
                    auVar57 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    auVar112 = ZEXT1664(auVar57);
                    auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                    auVar113 = ZEXT1664(auVar57);
                    auVar57 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                    auVar114 = ZEXT1664(auVar57);
                    break;
                  }
                  goto LAB_008248a5;
                }
                uVar9 = vcmpps_avx512vl(auVar115._0_16_,(undefined1  [16])tray.tfar.field_0,9);
                uVar40 = root.ptr & 0xfffffffffffffff0;
                uVar43 = (uint)root.ptr & 7;
                auVar115 = ZEXT1664(auVar112._0_16_);
                uVar49 = 0;
                root.ptr = 8;
                do {
                  sVar2 = *(size_t *)(uVar40 + uVar49 * 8);
                  if (sVar2 != 8) {
                    if ((uVar43 == 6) || (uVar43 == 1)) {
                      uVar46 = *(undefined4 *)(uVar40 + 0x100 + uVar49 * 4);
                      auVar72._4_4_ = uVar46;
                      auVar72._0_4_ = uVar46;
                      auVar72._8_4_ = uVar46;
                      auVar72._12_4_ = uVar46;
                      auVar54 = *(undefined1 (*) [16])(ray + 0x70);
                      uVar46 = *(undefined4 *)(uVar40 + 0x40 + uVar49 * 4);
                      auVar55._4_4_ = uVar46;
                      auVar55._0_4_ = uVar46;
                      auVar55._8_4_ = uVar46;
                      auVar55._12_4_ = uVar46;
                      auVar55 = vfmadd213ps_avx512vl(auVar72,auVar54,auVar55);
                      uVar46 = *(undefined4 *)(uVar40 + 0x140 + uVar49 * 4);
                      auVar74._4_4_ = uVar46;
                      auVar74._0_4_ = uVar46;
                      auVar74._8_4_ = uVar46;
                      auVar74._12_4_ = uVar46;
                      uVar46 = *(undefined4 *)(uVar40 + 0x80 + uVar49 * 4);
                      auVar14._4_4_ = uVar46;
                      auVar14._0_4_ = uVar46;
                      auVar14._8_4_ = uVar46;
                      auVar14._12_4_ = uVar46;
                      auVar53 = vfmadd213ps_avx512vl(auVar74,auVar54,auVar14);
                      uVar46 = *(undefined4 *)(uVar40 + 0x180 + uVar49 * 4);
                      auVar77._4_4_ = uVar46;
                      auVar77._0_4_ = uVar46;
                      auVar77._8_4_ = uVar46;
                      auVar77._12_4_ = uVar46;
                      uVar46 = *(undefined4 *)(uVar40 + 0xc0 + uVar49 * 4);
                      auVar15._4_4_ = uVar46;
                      auVar15._0_4_ = uVar46;
                      auVar15._8_4_ = uVar46;
                      auVar15._12_4_ = uVar46;
                      auVar56 = vfmadd213ps_avx512vl(auVar77,auVar54,auVar15);
                      uVar46 = *(undefined4 *)(uVar40 + 0x120 + uVar49 * 4);
                      auVar80._4_4_ = uVar46;
                      auVar80._0_4_ = uVar46;
                      auVar80._8_4_ = uVar46;
                      auVar80._12_4_ = uVar46;
                      uVar46 = *(undefined4 *)(uVar40 + 0x60 + uVar49 * 4);
                      auVar16._4_4_ = uVar46;
                      auVar16._0_4_ = uVar46;
                      auVar16._8_4_ = uVar46;
                      auVar16._12_4_ = uVar46;
                      auVar52 = vfmadd213ps_avx512vl(auVar80,auVar54,auVar16);
                      uVar46 = *(undefined4 *)(uVar40 + 0x160 + uVar49 * 4);
                      auVar83._4_4_ = uVar46;
                      auVar83._0_4_ = uVar46;
                      auVar83._8_4_ = uVar46;
                      auVar83._12_4_ = uVar46;
                      uVar46 = *(undefined4 *)(uVar40 + 0xa0 + uVar49 * 4);
                      auVar17._4_4_ = uVar46;
                      auVar17._0_4_ = uVar46;
                      auVar17._8_4_ = uVar46;
                      auVar17._12_4_ = uVar46;
                      auVar58 = vfmadd213ps_avx512vl(auVar83,auVar54,auVar17);
                      uVar46 = *(undefined4 *)(uVar40 + 0x1a0 + uVar49 * 4);
                      auVar87._4_4_ = uVar46;
                      auVar87._0_4_ = uVar46;
                      auVar87._8_4_ = uVar46;
                      auVar87._12_4_ = uVar46;
                      uVar46 = *(undefined4 *)(uVar40 + 0xe0 + uVar49 * 4);
                      auVar18._4_4_ = uVar46;
                      auVar18._0_4_ = uVar46;
                      auVar18._8_4_ = uVar46;
                      auVar18._12_4_ = uVar46;
                      auVar59 = vfmadd213ps_avx512vl(auVar87,auVar54,auVar18);
                      auVar30._8_8_ = tray.org.field_0._8_8_;
                      auVar30._0_8_ = tray.org.field_0._0_8_;
                      auVar32._8_8_ = tray.org.field_0._24_8_;
                      auVar32._0_8_ = tray.org.field_0._16_8_;
                      auVar34._8_8_ = tray.org.field_0._40_8_;
                      auVar34._0_8_ = tray.org.field_0._32_8_;
                      auVar55 = vsubps_avx(auVar55,auVar30);
                      auVar96._0_4_ = tray.rdir.field_0._0_4_ * auVar55._0_4_;
                      auVar96._4_4_ = tray.rdir.field_0._4_4_ * auVar55._4_4_;
                      auVar96._8_4_ = tray.rdir.field_0._8_4_ * auVar55._8_4_;
                      auVar96._12_4_ = tray.rdir.field_0._12_4_ * auVar55._12_4_;
                      auVar55 = vsubps_avx(auVar53,auVar32);
                      auVar75._0_4_ = auVar55._0_4_ * (float)tray.rdir.field_0._16_4_;
                      auVar75._4_4_ = auVar55._4_4_ * (float)tray.rdir.field_0._20_4_;
                      auVar75._8_4_ = auVar55._8_4_ * (float)tray.rdir.field_0._24_4_;
                      auVar75._12_4_ = auVar55._12_4_ * (float)tray.rdir.field_0._28_4_;
                      auVar55 = vsubps_avx(auVar56,auVar34);
                      auVar78._0_4_ = tray.rdir.field_0._32_4_ * auVar55._0_4_;
                      auVar78._4_4_ = tray.rdir.field_0._36_4_ * auVar55._4_4_;
                      auVar78._8_4_ = tray.rdir.field_0._40_4_ * auVar55._8_4_;
                      auVar78._12_4_ = tray.rdir.field_0._44_4_ * auVar55._12_4_;
                      auVar55 = vsubps_avx(auVar52,auVar30);
                      auVar81._0_4_ = tray.rdir.field_0._0_4_ * auVar55._0_4_;
                      auVar81._4_4_ = tray.rdir.field_0._4_4_ * auVar55._4_4_;
                      auVar81._8_4_ = tray.rdir.field_0._8_4_ * auVar55._8_4_;
                      auVar81._12_4_ = tray.rdir.field_0._12_4_ * auVar55._12_4_;
                      auVar55 = vsubps_avx(auVar58,auVar32);
                      auVar84._0_4_ = auVar55._0_4_ * (float)tray.rdir.field_0._16_4_;
                      auVar84._4_4_ = auVar55._4_4_ * (float)tray.rdir.field_0._20_4_;
                      auVar84._8_4_ = auVar55._8_4_ * (float)tray.rdir.field_0._24_4_;
                      auVar84._12_4_ = auVar55._12_4_ * (float)tray.rdir.field_0._28_4_;
                      auVar55 = vsubps_avx(auVar59,auVar34);
                      auVar88._0_4_ = tray.rdir.field_0._32_4_ * auVar55._0_4_;
                      auVar88._4_4_ = tray.rdir.field_0._36_4_ * auVar55._4_4_;
                      auVar88._8_4_ = tray.rdir.field_0._40_4_ * auVar55._8_4_;
                      auVar88._12_4_ = tray.rdir.field_0._44_4_ * auVar55._12_4_;
                      auVar55 = vpminsd_avx(auVar96,auVar81);
                      auVar53 = vpminsd_avx(auVar75,auVar84);
                      auVar55 = vpmaxsd_avx(auVar55,auVar53);
                      auVar53 = vpminsd_avx(auVar78,auVar88);
                      auVar55 = vpmaxsd_avx(auVar55,auVar53);
                      auVar56 = vmulps_avx512vl(auVar55,auVar113._0_16_);
                      auVar55 = vpmaxsd_avx(auVar96,auVar81);
                      auVar53 = vpmaxsd_avx(auVar75,auVar84);
                      auVar53 = vpminsd_avx(auVar55,auVar53);
                      auVar55 = vpmaxsd_avx(auVar78,auVar88);
                      auVar55 = vpminsd_avx(auVar53,auVar55);
                      auVar53 = vmulps_avx512vl(auVar55,auVar114._0_16_);
                      auVar55 = vpmaxsd_avx(auVar56,(undefined1  [16])tray.tnear.field_0);
                      auVar53 = vpminsd_avx(auVar53,(undefined1  [16])tray.tfar.field_0);
                      uVar11 = vcmpps_avx512vl(auVar55,auVar53,2);
                      bVar36 = (byte)uVar11;
                      if (uVar43 == 6) {
                        uVar46 = *(undefined4 *)(uVar40 + 0x1e0 + uVar49 * 4);
                        auVar19._4_4_ = uVar46;
                        auVar19._0_4_ = uVar46;
                        auVar19._8_4_ = uVar46;
                        auVar19._12_4_ = uVar46;
                        uVar11 = vcmpps_avx512vl(auVar54,auVar19,1);
                        uVar46 = *(undefined4 *)(uVar40 + 0x1c0 + uVar49 * 4);
                        auVar20._4_4_ = uVar46;
                        auVar20._0_4_ = uVar46;
                        auVar20._8_4_ = uVar46;
                        auVar20._12_4_ = uVar46;
                        uVar12 = vcmpps_avx512vl(auVar54,auVar20,0xd);
                        bVar36 = (byte)uVar11 & (byte)uVar12 & bVar36;
                      }
                    }
                    else {
                      uVar46 = *(undefined4 *)(uVar40 + 0x40 + uVar49 * 4);
                      auVar85._4_4_ = uVar46;
                      auVar85._0_4_ = uVar46;
                      auVar85._8_4_ = uVar46;
                      auVar85._12_4_ = uVar46;
                      uVar46 = *(undefined4 *)(uVar40 + 0x60 + uVar49 * 4);
                      auVar82._4_4_ = uVar46;
                      auVar82._0_4_ = uVar46;
                      auVar82._8_4_ = uVar46;
                      auVar82._12_4_ = uVar46;
                      uVar46 = *(undefined4 *)(uVar40 + 0x80 + uVar49 * 4);
                      auVar79._4_4_ = uVar46;
                      auVar79._0_4_ = uVar46;
                      auVar79._8_4_ = uVar46;
                      auVar79._12_4_ = uVar46;
                      uVar46 = *(undefined4 *)(uVar40 + 0xa0 + uVar49 * 4);
                      auVar97._4_4_ = uVar46;
                      auVar97._0_4_ = uVar46;
                      auVar97._8_4_ = uVar46;
                      auVar97._12_4_ = uVar46;
                      uVar46 = *(undefined4 *)(uVar40 + 0xc0 + uVar49 * 4);
                      auVar94._4_4_ = uVar46;
                      auVar94._0_4_ = uVar46;
                      auVar94._8_4_ = uVar46;
                      auVar94._12_4_ = uVar46;
                      uVar46 = *(undefined4 *)(uVar40 + 0xe0 + uVar49 * 4);
                      auVar93._4_4_ = uVar46;
                      auVar93._0_4_ = uVar46;
                      auVar93._8_4_ = uVar46;
                      auVar93._12_4_ = uVar46;
                      uVar46 = *(undefined4 *)(uVar40 + 0x100 + uVar49 * 4);
                      auVar76._4_4_ = uVar46;
                      auVar76._0_4_ = uVar46;
                      auVar76._8_4_ = uVar46;
                      auVar76._12_4_ = uVar46;
                      uVar46 = *(undefined4 *)(uVar40 + 0x120 + uVar49 * 4);
                      auVar73._4_4_ = uVar46;
                      auVar73._0_4_ = uVar46;
                      auVar73._8_4_ = uVar46;
                      auVar73._12_4_ = uVar46;
                      fVar89 = *(float *)(uVar40 + 0x140 + uVar49 * 4);
                      auVar70._4_4_ = fVar89;
                      auVar70._0_4_ = fVar89;
                      auVar70._8_4_ = fVar89;
                      auVar70._12_4_ = fVar89;
                      auVar54 = *(undefined1 (*) [16])(ray + 0x70);
                      auVar66 = auVar109._0_16_;
                      auVar55 = vsubps_avx512vl(auVar66,auVar54);
                      uVar46 = *(undefined4 *)(uVar40 + 0x1c0 + uVar49 * 4);
                      auVar21._4_4_ = uVar46;
                      auVar21._0_4_ = uVar46;
                      auVar21._8_4_ = uVar46;
                      auVar21._12_4_ = uVar46;
                      auVar53 = vmulps_avx512vl(auVar54,auVar21);
                      uVar46 = *(undefined4 *)(uVar40 + 0x1e0 + uVar49 * 4);
                      auVar22._4_4_ = uVar46;
                      auVar22._0_4_ = uVar46;
                      auVar22._8_4_ = uVar46;
                      auVar22._12_4_ = uVar46;
                      auVar56 = vmulps_avx512vl(auVar54,auVar22);
                      uVar46 = *(undefined4 *)(uVar40 + 0x200 + uVar49 * 4);
                      auVar23._4_4_ = uVar46;
                      auVar23._0_4_ = uVar46;
                      auVar23._8_4_ = uVar46;
                      auVar23._12_4_ = uVar46;
                      auVar52 = vmulps_avx512vl(auVar54,auVar23);
                      auVar53 = vfmadd231ps_avx512vl(auVar53,auVar55,auVar57);
                      auVar56 = vfmadd231ps_avx512vl(auVar56,auVar55,auVar57);
                      uVar46 = *(undefined4 *)(uVar40 + 0x220 + uVar49 * 4);
                      auVar24._4_4_ = uVar46;
                      auVar24._0_4_ = uVar46;
                      auVar24._8_4_ = uVar46;
                      auVar24._12_4_ = uVar46;
                      auVar58 = vmulps_avx512vl(auVar54,auVar24);
                      uVar46 = *(undefined4 *)(uVar40 + 0x240 + uVar49 * 4);
                      auVar25._4_4_ = uVar46;
                      auVar25._0_4_ = uVar46;
                      auVar25._8_4_ = uVar46;
                      auVar25._12_4_ = uVar46;
                      auVar59 = vmulps_avx512vl(auVar54,auVar25);
                      uVar46 = *(undefined4 *)(uVar40 + 0x260 + uVar49 * 4);
                      auVar26._4_4_ = uVar46;
                      auVar26._0_4_ = uVar46;
                      auVar26._8_4_ = uVar46;
                      auVar26._12_4_ = uVar46;
                      auVar54 = vmulps_avx512vl(auVar54,auVar26);
                      auVar52 = vfmadd231ps_avx512vl(auVar52,auVar55,auVar57);
                      auVar105._0_4_ = auVar55._0_4_ + auVar58._0_4_;
                      auVar105._4_4_ = auVar55._4_4_ + auVar58._4_4_;
                      auVar105._8_4_ = auVar55._8_4_ + auVar58._8_4_;
                      auVar105._12_4_ = auVar55._12_4_ + auVar58._12_4_;
                      auVar58 = vaddps_avx512vl(auVar55,auVar59);
                      auVar100._0_4_ = auVar55._0_4_ + auVar54._0_4_;
                      auVar100._4_4_ = auVar55._4_4_ + auVar54._4_4_;
                      auVar100._8_4_ = auVar55._8_4_ + auVar54._8_4_;
                      auVar100._12_4_ = auVar55._12_4_ + auVar54._12_4_;
                      auVar31._8_8_ = tray.org.field_0._8_8_;
                      auVar31._0_8_ = tray.org.field_0._0_8_;
                      auVar33._8_8_ = tray.org.field_0._24_8_;
                      auVar33._0_8_ = tray.org.field_0._16_8_;
                      auVar35._8_8_ = tray.org.field_0._40_8_;
                      auVar35._0_8_ = tray.org.field_0._32_8_;
                      auVar54 = vmulps_avx512vl(auVar76,(undefined1  [16])
                                                        tray.dir.field_0.field_0.z.field_0);
                      auVar55 = vmulps_avx512vl(auVar73,(undefined1  [16])
                                                        tray.dir.field_0.field_0.z.field_0);
                      auVar106._0_4_ = tray.dir.field_0._32_4_ * fVar89;
                      auVar106._4_4_ = tray.dir.field_0._36_4_ * fVar89;
                      auVar106._8_4_ = tray.dir.field_0._40_4_ * fVar89;
                      auVar106._12_4_ = tray.dir.field_0._44_4_ * fVar89;
                      auVar54 = vfmadd231ps_avx512vl
                                          (auVar54,(undefined1  [16])
                                                   tray.dir.field_0.field_0.y.field_0,auVar97);
                      auVar55 = vfmadd231ps_avx512vl
                                          (auVar55,(undefined1  [16])
                                                   tray.dir.field_0.field_0.y.field_0,auVar94);
                      auVar59 = vfmadd231ps_avx512vl
                                          (auVar106,auVar93,
                                           (undefined1  [16])tray.dir.field_0.field_0.y.field_0);
                      auVar54 = vfmadd231ps_avx512vl
                                          (auVar54,(undefined1  [16])
                                                   tray.dir.field_0.field_0.x.field_0,auVar85);
                      auVar55 = vfmadd231ps_avx512vl
                                          (auVar55,(undefined1  [16])
                                                   tray.dir.field_0.field_0.x.field_0,auVar82);
                      auVar59 = vfmadd231ps_avx512vl
                                          (auVar59,auVar79,
                                           (undefined1  [16])tray.dir.field_0.field_0.x.field_0);
                      auVar64 = auVar107._0_16_;
                      auVar60 = vandps_avx512vl(auVar54,auVar64);
                      auVar65 = auVar108._0_16_;
                      uVar50 = vcmpps_avx512vl(auVar60,auVar65,1);
                      bVar48 = (bool)((byte)uVar50 & 1);
                      iVar51 = auVar108._0_4_;
                      auVar61._0_4_ = (uint)bVar48 * iVar51 | (uint)!bVar48 * auVar54._0_4_;
                      bVar48 = (bool)((byte)(uVar50 >> 1) & 1);
                      iVar67 = auVar108._4_4_;
                      auVar61._4_4_ = (uint)bVar48 * iVar67 | (uint)!bVar48 * auVar54._4_4_;
                      bVar48 = (bool)((byte)(uVar50 >> 2) & 1);
                      iVar68 = auVar108._8_4_;
                      iVar69 = auVar108._12_4_;
                      auVar61._8_4_ = (uint)bVar48 * iVar68 | (uint)!bVar48 * auVar54._8_4_;
                      bVar48 = (bool)((byte)(uVar50 >> 3) & 1);
                      auVar61._12_4_ = (uint)bVar48 * iVar69 | (uint)!bVar48 * auVar54._12_4_;
                      auVar54 = vandps_avx512vl(auVar55,auVar64);
                      uVar50 = vcmpps_avx512vl(auVar54,auVar65,1);
                      bVar48 = (bool)((byte)uVar50 & 1);
                      auVar62._0_4_ = (uint)bVar48 * iVar51 | (uint)!bVar48 * auVar55._0_4_;
                      bVar48 = (bool)((byte)(uVar50 >> 1) & 1);
                      auVar62._4_4_ = (uint)bVar48 * iVar67 | (uint)!bVar48 * auVar55._4_4_;
                      bVar48 = (bool)((byte)(uVar50 >> 2) & 1);
                      auVar62._8_4_ = (uint)bVar48 * iVar68 | (uint)!bVar48 * auVar55._8_4_;
                      bVar48 = (bool)((byte)(uVar50 >> 3) & 1);
                      auVar62._12_4_ = (uint)bVar48 * iVar69 | (uint)!bVar48 * auVar55._12_4_;
                      auVar54 = vandps_avx512vl(auVar59,auVar64);
                      uVar50 = vcmpps_avx512vl(auVar54,auVar65,1);
                      bVar48 = (bool)((byte)uVar50 & 1);
                      auVar63._0_4_ = (uint)bVar48 * iVar51 | (uint)!bVar48 * auVar59._0_4_;
                      bVar48 = (bool)((byte)(uVar50 >> 1) & 1);
                      auVar63._4_4_ = (uint)bVar48 * iVar67 | (uint)!bVar48 * auVar59._4_4_;
                      bVar48 = (bool)((byte)(uVar50 >> 2) & 1);
                      auVar63._8_4_ = (uint)bVar48 * iVar68 | (uint)!bVar48 * auVar59._8_4_;
                      bVar48 = (bool)((byte)(uVar50 >> 3) & 1);
                      auVar63._12_4_ = (uint)bVar48 * iVar69 | (uint)!bVar48 * auVar59._12_4_;
                      auVar54 = vrcp14ps_avx512vl(auVar61);
                      auVar55 = vfnmadd213ps_avx512vl(auVar61,auVar54,auVar66);
                      auVar55 = vfmadd132ps_avx512vl(auVar55,auVar54,auVar54);
                      auVar54 = vrcp14ps_avx512vl(auVar62);
                      auVar59 = vfnmadd213ps_avx512vl(auVar62,auVar54,auVar66);
                      auVar59 = vfmadd132ps_avx512vl(auVar59,auVar54,auVar54);
                      auVar60 = vrcp14ps_avx512vl(auVar63);
                      auVar64 = vfnmadd213ps_avx512vl(auVar63,auVar60,auVar66);
                      uVar46 = *(undefined4 *)(uVar40 + 0x160 + uVar49 * 4);
                      auVar54._4_4_ = uVar46;
                      auVar54._0_4_ = uVar46;
                      auVar54._8_4_ = uVar46;
                      auVar54._12_4_ = uVar46;
                      auVar54 = vfmadd213ps_avx512vl(auVar76,auVar35,auVar54);
                      uVar46 = *(undefined4 *)(uVar40 + 0x180 + uVar49 * 4);
                      auVar27._4_4_ = uVar46;
                      auVar27._0_4_ = uVar46;
                      auVar27._8_4_ = uVar46;
                      auVar27._12_4_ = uVar46;
                      auVar65 = vfmadd213ps_avx512vl(auVar73,auVar35,auVar27);
                      uVar46 = *(undefined4 *)(uVar40 + 0x1a0 + uVar49 * 4);
                      auVar28._4_4_ = uVar46;
                      auVar28._0_4_ = uVar46;
                      auVar28._8_4_ = uVar46;
                      auVar28._12_4_ = uVar46;
                      auVar66 = vfmadd213ps_avx512vl(auVar70,auVar35,auVar28);
                      auVar60 = vfmadd132ps_avx512vl(auVar64,auVar60,auVar60);
                      auVar54 = vfmadd231ps_avx512vl(auVar54,auVar33,auVar97);
                      auVar64 = vfmadd231ps_avx512vl(auVar65,auVar33,auVar94);
                      auVar65 = vfmadd231ps_avx512vl(auVar66,auVar33,auVar93);
                      auVar66 = vfmadd231ps_avx512vl(auVar54,auVar31,auVar85);
                      auVar64 = vfmadd231ps_avx512vl(auVar64,auVar31,auVar82);
                      auVar65 = vfmadd231ps_avx512vl(auVar65,auVar31,auVar79);
                      auVar54 = vsubps_avx(auVar53,auVar66);
                      auVar53 = vmulps_avx512vl(auVar55,auVar54);
                      auVar54 = vsubps_avx(auVar56,auVar64);
                      auVar56 = vmulps_avx512vl(auVar59,auVar54);
                      auVar54 = vsubps_avx(auVar52,auVar65);
                      auVar86._0_4_ = auVar60._0_4_ * auVar54._0_4_;
                      auVar86._4_4_ = auVar60._4_4_ * auVar54._4_4_;
                      auVar86._8_4_ = auVar60._8_4_ * auVar54._8_4_;
                      auVar86._12_4_ = auVar60._12_4_ * auVar54._12_4_;
                      auVar54 = vsubps_avx(auVar105,auVar66);
                      auVar52 = vmulps_avx512vl(auVar55,auVar54);
                      auVar54 = vsubps_avx(auVar58,auVar64);
                      auVar58 = vmulps_avx512vl(auVar59,auVar54);
                      auVar54 = vsubps_avx(auVar100,auVar65);
                      auVar71._0_4_ = auVar60._0_4_ * auVar54._0_4_;
                      auVar71._4_4_ = auVar60._4_4_ * auVar54._4_4_;
                      auVar71._8_4_ = auVar60._8_4_ * auVar54._8_4_;
                      auVar71._12_4_ = auVar60._12_4_ * auVar54._12_4_;
                      auVar54 = vpminsd_avx(auVar53,auVar52);
                      auVar55 = vpminsd_avx(auVar56,auVar58);
                      auVar54 = vpmaxsd_avx(auVar54,auVar55);
                      auVar55 = vpminsd_avx(auVar86,auVar71);
                      auVar54 = vpmaxsd_avx(auVar54,auVar55);
                      auVar55 = vpmaxsd_avx(auVar53,auVar52);
                      auVar53 = vpmaxsd_avx(auVar56,auVar58);
                      auVar53 = vpminsd_avx(auVar55,auVar53);
                      auVar55 = vpmaxsd_avx(auVar86,auVar71);
                      auVar55 = vpminsd_avx(auVar53,auVar55);
                      auVar56 = vmulps_avx512vl(auVar54,auVar113._0_16_);
                      auVar54 = vmulps_avx512vl(auVar55,auVar114._0_16_);
                      auVar55 = vpmaxsd_avx(auVar56,(undefined1  [16])tray.tnear.field_0);
                      auVar54 = vpminsd_avx(auVar54,(undefined1  [16])tray.tfar.field_0);
                      uVar11 = vcmpps_avx512vl(auVar55,auVar54,2);
                      bVar36 = (byte)uVar11;
                    }
                    bVar36 = bVar36 & (byte)uVar9;
                    if (bVar36 != 0) {
                      auVar55 = vblendmps_avx512vl(auVar112._0_16_,auVar56);
                      bVar48 = (bool)(bVar36 >> 1 & 1);
                      bVar4 = (bool)(bVar36 >> 2 & 1);
                      bVar5 = (bool)(bVar36 >> 3 & 1);
                      if (root.ptr != 8) {
                        pNVar44->ptr = root.ptr;
                        pNVar44 = pNVar44 + 1;
                        *paVar47 = auVar115._0_16_;
                        paVar47 = paVar47 + 1;
                      }
                      auVar115 = ZEXT1664(CONCAT412((uint)bVar5 * auVar55._12_4_ |
                                                    (uint)!bVar5 * auVar54._12_4_,
                                                    CONCAT48((uint)bVar4 * auVar55._8_4_ |
                                                             (uint)!bVar4 * auVar54._8_4_,
                                                             CONCAT44((uint)bVar48 * auVar55._4_4_ |
                                                                      (uint)!bVar48 * auVar54._4_4_,
                                                                      (uint)(bVar36 & 1) *
                                                                      auVar55._0_4_ |
                                                                      (uint)!(bool)(bVar36 & 1) *
                                                                      auVar54._0_4_))));
                      root.ptr = sVar2;
                    }
                  }
                } while ((sVar2 != 8) && (bVar48 = uVar49 < 7, uVar49 = uVar49 + 1, bVar48));
                iVar51 = 0;
                if (root.ptr == 8) {
LAB_00824745:
                  bVar48 = false;
                  iVar51 = 4;
                }
                else {
                  uVar9 = vcmpps_avx512vl((undefined1  [16])auVar115._0_16_,
                                          (undefined1  [16])tray.tfar.field_0,9);
                  bVar48 = true;
                  if ((uint)POPCOUNT((int)uVar9) <= uVar45) {
                    pNVar44->ptr = root.ptr;
                    pNVar44 = pNVar44 + 1;
                    *paVar47 = auVar115._0_16_;
                    paVar47 = paVar47 + 1;
                    goto LAB_00824745;
                  }
                }
              } while (bVar48);
            }
          }
        }
      } while (iVar51 != 3);
      bVar39 = (byte)uVar42 & bVar39;
      bVar48 = (bool)(bVar39 >> 1 & 1);
      bVar4 = (bool)(bVar39 >> 2 & 1);
      *(uint *)(ray + 0x80) =
           (uint)(bVar39 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar39 & 1) * *(int *)(ray + 0x80);
      *(uint *)(ray + 0x84) = (uint)bVar48 * auVar111._4_4_ | (uint)!bVar48 * *(int *)(ray + 0x84);
      *(uint *)(ray + 0x88) = (uint)bVar4 * auVar111._8_4_ | (uint)!bVar4 * *(int *)(ray + 0x88);
      *(uint *)(ray + 0x8c) =
           (uint)(bVar39 >> 3) * auVar111._12_4_ | (uint)!(bool)(bVar39 >> 3) * *(int *)(ray + 0x8c)
      ;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }